

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O1

void tcg_gen_not_vec_sparc64(TCGContext_conflict8 *tcg_ctx,uint vece,TCGv_vec r,TCGv_vec a)

{
  ushort uVar1;
  uintptr_t o_2;
  TCGv_vec pTVar2;
  TCGOp *pTVar3;
  TCGTemp *rt;
  uintptr_t o_1;
  uintptr_t o;
  
  pTVar2 = tcg_const_ones_vec_sparc64
                     (tcg_ctx,(uint)(byte)((undefined1 *)((long)&tcg_ctx->pool_cur + 2))[(long)r]);
  uVar1 = *(ushort *)((undefined1 *)((long)&tcg_ctx->pool_cur + 2) + (long)r);
  pTVar3 = tcg_emit_op_sparc64(tcg_ctx,INDEX_op_xor_vec);
  pTVar3->field_0x1 = (byte)((uint)uVar1 * 0x100 + 0xe00 >> 8) & 0xf;
  pTVar3->args[0] = (TCGArg)(r + (long)&tcg_ctx->pool_cur);
  pTVar3->args[1] = (TCGArg)(a + (long)tcg_ctx);
  pTVar3->args[2] = (TCGArg)(pTVar2 + (long)tcg_ctx);
  tcg_temp_free_internal_sparc64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_not_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_vec a)
{
    const TCGOpcode *hold_list = tcg_swap_vecop_list(NULL);

    if (!TCG_TARGET_HAS_not_vec || !do_op2(tcg_ctx, vece, r, a, INDEX_op_not_vec)) {
        TCGv_vec t = tcg_const_ones_vec_matching(tcg_ctx, r);
        tcg_gen_xor_vec(tcg_ctx, 0, r, a, t);
        tcg_temp_free_vec(tcg_ctx, t);
    }
    tcg_swap_vecop_list(hold_list);
}